

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O3

void act_var_bump(sat_solver3 *s,int v)

{
  int iVar1;
  word *pwVar2;
  uint uVar3;
  int *orderpos;
  int *piVar4;
  word wVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  
  iVar1 = s->VarActType;
  if (iVar1 == 2) {
    uVar9 = s->var_inc;
    pwVar2 = s->activity;
    uVar10 = pwVar2[v];
    uVar8 = uVar9;
    if (uVar10 >= uVar9 && uVar10 != uVar9) {
      uVar8 = uVar10;
    }
    if (uVar10 < uVar9) {
      uVar9 = uVar10;
    }
    uVar10 = ((uVar9 & 0xffffffffffff) >> ((char)(uVar8 >> 0x30) - (char)(uVar9 >> 0x30) & 0x3fU)) +
             (uVar8 & 0xffffffffffff);
    uVar9 = (uVar8 >> 0x30) + (uVar10 >> 0x30);
    uVar10 = uVar10 >> ((byte)(uVar10 >> 0x30) & 0x3f);
    if (uVar9 < 0x10000) {
      if ((uVar10 & 0x1800000000000) != 0x800000000000) {
        __assert_fail("!(Exp>>16) && (Mnt>>47)==(word)1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilDouble.h"
                      ,0x36,"xdbl Xdbl_Create(word, word)");
      }
      uVar10 = uVar9 << 0x30 | uVar10;
      pwVar2[v] = uVar10;
      if (0x14c924d692ca61b < uVar10) goto LAB_009041d1;
    }
    else {
      pwVar2[v] = 0xffffffffffffffff;
LAB_009041d1:
      act_var_rescale(s);
    }
    piVar4 = s->orderpos;
    uVar9 = (ulong)piVar4[v];
    if (uVar9 == 0xffffffffffffffff) {
      return;
    }
    piVar6 = (s->order).ptr;
    lVar7 = (long)piVar6[uVar9];
    if (piVar4[v] != 0) {
      pwVar2 = s->activity;
      uVar10 = pwVar2[lVar7];
      do {
        uVar3 = (uint)uVar9;
        uVar11 = (int)((uVar3 - ((int)(uVar3 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar6[(int)uVar11];
        uVar12 = uVar3;
        if (uVar10 <= pwVar2[iVar1]) break;
        piVar6[(int)uVar3] = iVar1;
        piVar4[iVar1] = uVar3;
        uVar9 = (ulong)uVar11;
        uVar12 = uVar11;
      } while (2 < uVar3);
      goto LAB_00904244;
    }
  }
  else if (iVar1 == 1) {
    dVar13 = (double)s->activity[v] + (double)s->var_inc;
    s->activity[v] = (word)dVar13;
    if (1e+100 < dVar13) {
      act_var_rescale(s);
    }
    piVar4 = s->orderpos;
    uVar9 = (ulong)piVar4[v];
    if (uVar9 == 0xffffffffffffffff) {
      return;
    }
    piVar6 = (s->order).ptr;
    lVar7 = (long)piVar6[uVar9];
    if (piVar4[v] != 0) {
      pwVar2 = s->activity;
      uVar10 = pwVar2[lVar7];
      do {
        uVar3 = (uint)uVar9;
        uVar11 = (int)((uVar3 - ((int)(uVar3 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar6[(int)uVar11];
        uVar12 = uVar3;
        if (uVar10 <= pwVar2[iVar1]) break;
        piVar6[(int)uVar3] = iVar1;
        piVar4[iVar1] = uVar3;
        uVar9 = (ulong)uVar11;
        uVar12 = uVar11;
      } while (2 < uVar3);
      goto LAB_00904244;
    }
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x146,"void act_var_bump(sat_solver3 *, int)");
    }
    wVar5 = s->activity[v] + s->var_inc;
    s->activity[v] = wVar5;
    if ((int)wVar5 < 0) {
      act_var_rescale(s);
    }
    piVar4 = s->orderpos;
    uVar9 = (ulong)piVar4[v];
    if (uVar9 == 0xffffffffffffffff) {
      return;
    }
    piVar6 = (s->order).ptr;
    lVar7 = (long)piVar6[uVar9];
    if (piVar4[v] != 0) {
      pwVar2 = s->activity;
      uVar10 = pwVar2[lVar7];
      do {
        uVar3 = (uint)uVar9;
        uVar11 = (int)((uVar3 - ((int)(uVar3 - 1) >> 0x1f)) + -1) >> 1;
        iVar1 = piVar6[(int)uVar11];
        uVar12 = uVar3;
        if (uVar10 <= pwVar2[iVar1]) break;
        piVar6[(int)uVar3] = iVar1;
        piVar4[iVar1] = uVar3;
        uVar9 = (ulong)uVar11;
        uVar12 = uVar11;
      } while (2 < uVar3);
      goto LAB_00904244;
    }
  }
  uVar12 = 0;
LAB_00904244:
  piVar6[(int)uVar12] = (int)lVar7;
  piVar4[lVar7] = uVar12;
  return;
}

Assistant:

static inline void act_var_bump(sat_solver3* s, int v) 
{
    if ( s->VarActType == 0 )
    {
        s->activity[v] += s->var_inc;
        if ((unsigned)s->activity[v] & 0x80000000)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 1 )
    {
        double act = Abc_Word2Dbl(s->activity[v]) + Abc_Word2Dbl(s->var_inc);
        s->activity[v] = Abc_Dbl2Word(act);
        if (act > 1e100)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 2 )
    {
        s->activity[v] = Xdbl_Add( s->activity[v], s->var_inc );
        if (s->activity[v] > ABC_CONST(0x014c924d692ca61b))
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else assert(0);
}